

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-sec-utils.c
# Opt level: O0

int determineAsn1IntLength(uint8_t *integer)

{
  int local_20;
  int local_1c;
  int i;
  int len;
  uint8_t *integer_local;
  
  if ((*integer & 0x80) == 0) {
    local_1c = 0x20;
    local_20 = 0;
    while ((local_20 < 0x1f && (integer[local_20] == '\0' && (integer[local_20 + 1] & 0x80) == 0)))
    {
      local_1c = local_1c + -1;
      local_20 = local_20 + 1;
    }
    integer_local._4_4_ = local_1c;
  }
  else {
    integer_local._4_4_ = 0x21;
  }
  return integer_local._4_4_;
}

Assistant:

static int
determineAsn1IntLength(const uint8_t* integer)
{
  if ((integer[0] & 0x80) != 0x00) {
    return 33;
  }

  int len = 32;
  for (int i = 0; i < 31; ++i) {
    if ((((uint16_t)(integer[i]) << 8) | (integer[i + 1] & 0x80)) != 0x0000) {
      break;
    }
    --len;
  }
  return len;
}